

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
eval_divide_knuth(uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
                 uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other,
                 uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *remainder)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  pointer pvVar4;
  long lVar5;
  unsigned_fast_type v_offset;
  ulong uVar6;
  unsigned_fast_type u_offset;
  pointer pvVar7;
  byte bVar8;
  size_type local_30;
  pointer local_28;
  
  pvVar7 = (this->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  uVar2 = (this->values).
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar6 = (ulong)(other->values).
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elem_count;
  if ((ulong)uVar2 == 0) {
    u_offset = 0;
  }
  else {
    lVar5 = (ulong)uVar2 * 4;
    u_offset = 0;
    do {
      if (*(int *)((long)pvVar7 + lVar5 + -4) != 0) break;
      u_offset = u_offset + 1;
      lVar5 = lVar5 + -4;
    } while (lVar5 != 0);
  }
  pvVar4 = (other->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  if (uVar6 == 0) {
    v_offset = 0;
  }
  else {
    lVar5 = uVar6 << 2;
    v_offset = 0;
    do {
      if (*(int *)((long)pvVar4 + lVar5 + -4) != 0) break;
      v_offset = v_offset + 1;
      lVar5 = lVar5 + -4;
    } while (lVar5 != 0);
  }
  if (v_offset == 0x80) {
    limits_helper_max<false>();
    uVar6 = (ulong)(this->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         local_30;
    pvVar7 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         local_28;
    if (uVar6 != 0) {
      operator_delete(pvVar7,uVar6 << 2);
    }
    if (remainder == (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0) {
      return;
    }
    uVar6 = (ulong)(remainder->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    if (uVar6 == 0) {
      return;
    }
    memset((remainder->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,
           0,uVar6 << 2);
    return;
  }
  if (u_offset != 0x80) {
    lVar5 = 0x1fc;
    do {
      bVar8 = 0;
      if (lVar5 == -4) break;
      puVar1 = (uint *)((long)pvVar7 + lVar5);
      uVar3 = *(uint *)((long)pvVar4 + lVar5);
      bVar8 = -(*puVar1 <= uVar3) | 1;
      lVar5 = lVar5 + -4;
    } while (*puVar1 == uVar3);
    if (bVar8 != 0) {
      if (bVar8 != 0xff) {
        void_math::wide_integer::uintwide_t<4096u,unsigned_int,std::allocator<unsigned_int>,false>::
        eval_divide_knuth_core<4096u>(unsigned_long,unsigned_long,math::wide_integer::
        uintwide_t<4096u,unsigned_int,std::allocator<unsigned_int>,false>const&,math::wide_integer::
        uintwide_t<4096u,unsigned_int,std::allocator<unsigned_int>,false>*,std::
        enable_if<((4096u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_int>::
        digits))),int>::type__
                  (this,u_offset,v_offset,other,remainder,
                   (enable_if_t<(4096U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                    *)0x0);
        return;
      }
      if (remainder != this &&
          remainder != (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0)
      {
        uVar3 = (remainder->values).
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elem_count;
        if (uVar2 < uVar3) {
          uVar3 = uVar2;
        }
        if (uVar3 != 0) {
          pvVar4 = (remainder->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems;
          lVar5 = 0;
          do {
            *(undefined4 *)((long)pvVar4 + lVar5) = *(undefined4 *)((long)pvVar7 + lVar5);
            lVar5 = lVar5 + 4;
          } while ((ulong)uVar3 * 4 != lVar5);
        }
      }
      pvVar4 = (pointer)operator_new(0x200);
      memset(pvVar4,0,0x200);
      memset(pvVar4,0,0x200);
      uVar2 = (this->values).
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elem_count;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
           = 0x80;
      pvVar7 = (this->values).
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elems;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
           pvVar4;
      goto LAB_001bafba;
    }
    pvVar4 = (pointer)operator_new(0x200);
    memset(pvVar4,0,0x200);
    memset(pvVar4,0,0x200);
    *pvVar4 = 1;
    uVar6 = (ulong)(this->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         0x80;
    pvVar7 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (this->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         pvVar4;
    if (uVar6 != 0) {
      operator_delete(pvVar7,uVar6 << 2);
    }
  }
  if (remainder == (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0) {
    return;
  }
  pvVar4 = (pointer)operator_new(0x200);
  memset(pvVar4,0,0x200);
  memset(pvVar4,0,0x200);
  uVar2 = (remainder->values).
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  (remainder->values).
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       0x80;
  pvVar7 = (remainder->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  (remainder->values).
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems = pvVar4;
LAB_001bafba:
  if ((ulong)uVar2 == 0) {
    return;
  }
  operator_delete(pvVar7,(ulong)uVar2 << 2);
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }